

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::AssertSnapEquiv_SnapArrayBufferInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  bool bVar1;
  SnapArrayBufferInfo *pSVar2;
  SnapArrayBufferInfo *pSVar3;
  uint32 i;
  ulong uVar4;
  
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapArrayBufferInfo*,(TTD::NSSnapObjects::SnapObjectType)23>
                     (sobj1);
  pSVar3 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapArrayBufferInfo*,(TTD::NSSnapObjects::SnapObjectType)23>
                     (sobj2);
  TTDCompareMap::DiagnosticAssert(compareMap,pSVar2->Length == pSVar3->Length);
  bVar1 = JsUtil::
          BaseHashSet<unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_long,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Contains(&compareMap->H1PendingAsyncModBufferSet,&sobj1->ObjectPtrId);
  if (!bVar1) {
    bVar1 = JsUtil::
            BaseHashSet<unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_long,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::Contains(&compareMap->H2PendingAsyncModBufferSet,&sobj2->ObjectPtrId);
    if (!bVar1) {
      for (uVar4 = 0; uVar4 < pSVar2->Length; uVar4 = uVar4 + 1) {
        TTDCompareMap::DiagnosticAssert(compareMap,pSVar2->Buff[uVar4] == pSVar3->Buff[uVar4]);
      }
      return;
    }
  }
  bVar1 = JsUtil::
          BaseHashSet<unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_long,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Contains(&compareMap->H1PendingAsyncModBufferSet,&sobj1->ObjectPtrId);
  if (bVar1) {
    bVar1 = JsUtil::
            BaseHashSet<unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_long,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::Contains(&compareMap->H2PendingAsyncModBufferSet,&sobj2->ObjectPtrId);
  }
  else {
    bVar1 = false;
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar1);
  return;
}

Assistant:

void AssertSnapEquiv_SnapArrayBufferInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            const SnapArrayBufferInfo* buffInfo1 = SnapObjectGetAddtlInfoAs<SnapArrayBufferInfo*, SnapObjectType::SnapArrayBufferObject>(sobj1);
            const SnapArrayBufferInfo* buffInfo2 = SnapObjectGetAddtlInfoAs<SnapArrayBufferInfo*, SnapObjectType::SnapArrayBufferObject>(sobj2);

            compareMap.DiagnosticAssert(buffInfo1->Length == buffInfo2->Length);

            //
            //Pending buffers cannot be accessed by the program until they are off the pending lists.
            //So we do not force the updates in closer sync than this and they may not be updated in sync so (as long as they are pending) in both.
            //
            if(compareMap.H1PendingAsyncModBufferSet.Contains(sobj1->ObjectPtrId) || compareMap.H2PendingAsyncModBufferSet.Contains(sobj2->ObjectPtrId))
            {
                compareMap.DiagnosticAssert(compareMap.H1PendingAsyncModBufferSet.Contains(sobj1->ObjectPtrId) && compareMap.H2PendingAsyncModBufferSet.Contains(sobj2->ObjectPtrId));
            }
            else
            {
                for(uint32 i = 0; i < buffInfo1->Length; ++i)
                {
                    compareMap.DiagnosticAssert(buffInfo1->Buff[i] == buffInfo2->Buff[i]);
                }
            }
        }